

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::SetPermissions(char *file,mode_t mode,bool honor_umask)

{
  allocator local_41;
  string local_40;
  byte local_1d;
  mode_t local_1c;
  bool honor_umask_local;
  char *pcStack_18;
  mode_t mode_local;
  char *file_local;
  
  if (file == (char *)0x0) {
    file_local._7_1_ = 0;
  }
  else {
    local_1d = honor_umask;
    local_1c = mode;
    pcStack_18 = file;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,file,&local_41);
    file_local._7_1_ = SetPermissions(&local_40,local_1c,(bool)(local_1d & 1));
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return (bool)(file_local._7_1_ & 1);
}

Assistant:

bool SystemTools::SetPermissions(const char* file, mode_t mode,
                                 bool honor_umask)
{
  if (!file) {
    return false;
  }
  return SystemTools::SetPermissions(std::string(file), mode, honor_umask);
}